

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::RecordLegacyLocation
          (LocationRecorder *this,Message *descriptor,ErrorLocation location)

{
  int iVar1;
  int iVar2;
  map<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>,_std::less<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>_>_>
  *this_00;
  Location *pLVar3;
  LogMessage *pLVar4;
  mapped_type *pmVar5;
  key_type local_b0;
  LogMessage local_a0;
  LogMessage local_68;
  
  this_00 = &this->parser_->source_location_table_->location_map_;
  if (this_00 !=
      (map<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>,_std::less<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>_>_>
       *)0x0) {
    pLVar3 = this->location_;
    if ((pLVar3->span_).current_size_ < 1) {
      internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x265);
      pLVar4 = internal::LogMessage::operator<<(&local_a0,"CHECK failed: (index) < (size()): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_68,pLVar4);
      internal::LogMessage::~LogMessage(&local_a0);
    }
    iVar1 = *(pLVar3->span_).elements_;
    pLVar3 = this->location_;
    if ((pLVar3->span_).current_size_ < 2) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x265);
      pLVar4 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (index) < (size()): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_b0,pLVar4);
      internal::LogMessage::~LogMessage(&local_68);
    }
    iVar2 = (pLVar3->span_).elements_[1];
    local_b0.first = descriptor;
    local_b0.second = location;
    pmVar5 = std::
             map<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>,_std::less<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>_>_>
             ::operator[](this_00,&local_b0);
    pmVar5->first = iVar1;
    pmVar5->second = iVar2;
  }
  return;
}

Assistant:

void Parser::LocationRecorder::RecordLegacyLocation(const Message* descriptor,
    DescriptorPool::ErrorCollector::ErrorLocation location) {
  if (parser_->source_location_table_ != NULL) {
    parser_->source_location_table_->Add(
        descriptor, location, location_->span(0), location_->span(1));
  }
}